

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variant.hpp
# Opt level: O3

bool goodform::convert<float>(any *v,float *dest)

{
  bool bVar1;
  bool bVar2;
  uint uVar3;
  char *pcVar4;
  short *psVar5;
  int *piVar6;
  long *plVar7;
  byte *pbVar8;
  unsigned_short *puVar9;
  uint *puVar10;
  ulong uVar11;
  unsigned_long *puVar12;
  float *pfVar13;
  double *pdVar14;
  float fVar15;
  
  bVar1 = can_be<float>(v);
  if (!bVar1) {
    return bVar1;
  }
  bVar2 = is<signed_char>(v);
  if (bVar2) {
    pcVar4 = get<signed_char>(v);
    uVar3 = (uint)*pcVar4;
  }
  else {
    bVar2 = is<short>(v);
    if (bVar2) {
      psVar5 = get<short>(v);
      uVar3 = (uint)*psVar5;
    }
    else {
      bVar2 = is<int>(v);
      if (bVar2) {
        piVar6 = get<int>(v);
        fVar15 = (float)*piVar6;
        goto LAB_00129ee1;
      }
      bVar2 = is<long>(v);
      if (bVar2) {
        plVar7 = get<long>(v);
        fVar15 = (float)*plVar7;
        goto LAB_00129ee1;
      }
      bVar2 = is<unsigned_char>(v);
      if (bVar2) {
        pbVar8 = get<unsigned_char>(v);
        uVar3 = (uint)*pbVar8;
      }
      else {
        bVar2 = is<unsigned_short>(v);
        if (!bVar2) {
          bVar2 = is<unsigned_int>(v);
          if (bVar2) {
            puVar10 = get<unsigned_int>(v);
            uVar11 = (ulong)*puVar10;
          }
          else {
            bVar2 = is<unsigned_long>(v);
            if (!bVar2) {
              bVar2 = is<float>(v);
              if (bVar2) {
                pfVar13 = get<float>(v);
                fVar15 = *pfVar13;
              }
              else {
                bVar2 = is<double>(v);
                if (!bVar2) {
                  return bVar1;
                }
                pdVar14 = get<double>(v);
                fVar15 = (float)*pdVar14;
              }
              goto LAB_00129ee1;
            }
            puVar12 = get<unsigned_long>(v);
            uVar11 = *puVar12;
            if ((long)uVar11 < 0) {
              fVar15 = (float)uVar11;
              goto LAB_00129ee1;
            }
          }
          fVar15 = (float)(long)uVar11;
          goto LAB_00129ee1;
        }
        puVar9 = get<unsigned_short>(v);
        uVar3 = (uint)*puVar9;
      }
    }
  }
  fVar15 = (float)(int)uVar3;
LAB_00129ee1:
  *dest = fVar15;
  return bVar1;
}

Assistant:

bool convert(const any& v, T& dest)
  {
    if (can_be<T>(v))
    {
      if (is<std::int8_t>(v))        dest = T(get<std::int8_t>(v));
      else if (is<std::int16_t>(v))  dest = T(get<std::int16_t>(v));
      else if (is<std::int32_t>(v))  dest = T(get<std::int32_t>(v));
      else if (is<std::int64_t>(v))  dest = T(get<std::int64_t>(v));
      else if (is<std::uint8_t>(v))  dest = T(get<std::uint8_t>(v));
      else if (is<std::uint16_t>(v)) dest = T(get<std::uint16_t>(v));
      else if (is<std::uint32_t>(v)) dest = T(get<std::uint32_t>(v));
      else if (is<std::uint64_t>(v)) dest = T(get<std::uint64_t>(v));
      else if (is<float>(v))         dest = T(get<float>(v));
      else if (is<double>(v))        dest = T(get<double>(v));
      return true;
    }
    return false;
  }